

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

void read_filter_intra_mode_info(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  aom_cdf_prob *paVar1;
  BLOCK_SIZE BVar2;
  ushort uVar3;
  ushort uVar4;
  MB_MODE_INFO *pMVar5;
  FRAME_CONTEXT *pFVar6;
  short sVar7;
  uint8_t uVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  aom_cdf_prob (*icdf) [3];
  
  pMVar5 = *xd->mi;
  if ((((pMVar5->mode == '\0') && ((pMVar5->palette_mode_info).palette_size[0] == '\0')) &&
      (uVar10 = (ulong)pMVar5->bsize, uVar10 != 0xff)) &&
     (((cm->seq_params->enable_filter_intra != '\0' && ((0x1f07ffUL >> (uVar10 & 0x3f) & 1) != 0))
      && ((0x2f0bffUL >> (uVar10 & 0x3f) & 1) != 0)))) {
    pFVar6 = xd->tile_ctx;
    BVar2 = pMVar5->bsize;
    icdf = pFVar6->filter_intra_cdfs + BVar2;
    iVar9 = od_ec_decode_cdf_q15(&r->ec,*icdf,2);
    uVar8 = (uint8_t)iVar9;
    if (r->allow_update_cdf != '\0') {
      uVar3 = pFVar6->filter_intra_cdfs[BVar2][2];
      bVar11 = (char)(uVar3 >> 4) + 4;
      uVar4 = (*icdf)[0];
      if ((char)uVar8 < '\x01') {
        sVar7 = -(uVar4 >> (bVar11 & 0x1f));
      }
      else {
        sVar7 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar11 & 0x1f));
      }
      (*icdf)[0] = sVar7 + uVar4;
      paVar1 = pFVar6->filter_intra_cdfs[BVar2] + 2;
      *paVar1 = *paVar1 + (ushort)(uVar3 < 0x20);
    }
    (pMVar5->filter_intra_mode_info).use_filter_intra = uVar8;
    if (uVar8 != '\0') {
      pFVar6 = xd->tile_ctx;
      paVar1 = pFVar6->filter_intra_mode_cdf;
      iVar9 = od_ec_decode_cdf_q15(&r->ec,paVar1,5);
      if (r->allow_update_cdf != '\0') {
        uVar3 = pFVar6->filter_intra_mode_cdf[5];
        bVar11 = (char)(uVar3 >> 4) + 5;
        lVar12 = 0;
        do {
          uVar4 = paVar1[lVar12];
          if (lVar12 < (char)(FILTER_INTRA_MODE)iVar9) {
            sVar7 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar11 & 0x1f));
          }
          else {
            sVar7 = -(uVar4 >> (bVar11 & 0x1f));
          }
          paVar1[lVar12] = sVar7 + uVar4;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        pFVar6->filter_intra_mode_cdf[5] = pFVar6->filter_intra_mode_cdf[5] + (ushort)(uVar3 < 0x20)
        ;
      }
      (pMVar5->filter_intra_mode_info).filter_intra_mode = (FILTER_INTRA_MODE)iVar9;
    }
  }
  else {
    (pMVar5->filter_intra_mode_info).use_filter_intra = '\0';
  }
  return;
}

Assistant:

static void read_filter_intra_mode_info(const AV1_COMMON *const cm,
                                        MACROBLOCKD *const xd, aom_reader *r) {
  MB_MODE_INFO *const mbmi = xd->mi[0];
  FILTER_INTRA_MODE_INFO *filter_intra_mode_info =
      &mbmi->filter_intra_mode_info;

  if (av1_filter_intra_allowed(cm, mbmi)) {
    filter_intra_mode_info->use_filter_intra = aom_read_symbol(
        r, xd->tile_ctx->filter_intra_cdfs[mbmi->bsize], 2, ACCT_STR);
    if (filter_intra_mode_info->use_filter_intra) {
      filter_intra_mode_info->filter_intra_mode = aom_read_symbol(
          r, xd->tile_ctx->filter_intra_mode_cdf, FILTER_INTRA_MODES, ACCT_STR);
    }
  } else {
    filter_intra_mode_info->use_filter_intra = 0;
  }
}